

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O2

void get_progress(void *coder_ptr,uint64_t *progress_in,uint64_t *progress_out)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  mythread_mutex_lock((mythread_mutex *)((long)coder_ptr + 0x168));
  *progress_in = *(uint64_t *)((long)coder_ptr + 0x158);
  *progress_out = *(uint64_t *)((long)coder_ptr + 0x160);
  lVar3 = 0x160;
  for (uVar2 = 0; uVar2 < *(uint *)((long)coder_ptr + 0x144); uVar2 = uVar2 + 1) {
    mythread_mutex_lock((mythread_mutex *)(*(long *)((long)coder_ptr + 0x138) + lVar3));
    lVar1 = *(long *)((long)coder_ptr + 0x138);
    *progress_in = *progress_in + *(long *)(lVar1 + -0x130 + lVar3);
    *progress_out = *progress_out + *(long *)(lVar1 + -0x128 + lVar3);
    mythread_mutex_unlock((mythread_mutex *)(lVar1 + lVar3));
    lVar3 = lVar3 + 0x1c0;
  }
  mythread_mutex_unlock((mythread_mutex *)((long)coder_ptr + 0x168));
  return;
}

Assistant:

static void
get_progress(void *coder_ptr, uint64_t *progress_in, uint64_t *progress_out)
{
	lzma_stream_coder *coder = coder_ptr;

	// Lock coder->mutex to prevent finishing threads from moving their
	// progress info from the worker_thread structure to lzma_stream_coder.
	mythread_sync(coder->mutex) {
		*progress_in = coder->progress_in;
		*progress_out = coder->progress_out;

		for (size_t i = 0; i < coder->threads_initialized; ++i) {
			mythread_sync(coder->threads[i].mutex) {
				*progress_in += coder->threads[i].progress_in;
				*progress_out += coder->threads[i]
						.progress_out;
			}
		}
	}